

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.c
# Opt level: O1

Image * ImageFromImage(Image *__return_storage_ptr__,Image image,Rectangle rec)

{
  int iVar1;
  void *pvVar2;
  int iVar3;
  int iVar4;
  void *__src;
  int iVar5;
  float fVar6;
  float local_68;
  float fStack_64;
  float local_48;
  float fStack_44;
  
  __return_storage_ptr__->data = (void *)0x0;
  __return_storage_ptr__->width = 0;
  __return_storage_ptr__->height = 0;
  __return_storage_ptr__->mipmaps = 0;
  __return_storage_ptr__->format = 0;
  iVar5 = 1;
  iVar1 = GetPixelDataSize(1,1,image.format);
  local_68 = rec.width;
  fStack_64 = rec.height;
  __return_storage_ptr__->width = (int)local_68;
  __return_storage_ptr__->height = (int)fStack_64;
  pvVar2 = calloc((long)((int)(local_68 * fStack_64) * iVar1),1);
  __return_storage_ptr__->data = pvVar2;
  __return_storage_ptr__->format = image.format;
  __return_storage_ptr__->mipmaps = 1;
  if (0.0 < fStack_64) {
    local_48 = rec.x;
    fStack_44 = rec.y;
    iVar4 = (int)local_68 * iVar1;
    __src = (void *)(((long)(int)fStack_44 * (long)image.width + (long)(int)local_48) * (long)iVar1
                    + (long)image.data);
    iVar3 = 0;
    do {
      memcpy((void *)((long)pvVar2 + (long)iVar3),__src,(long)iVar4);
      fVar6 = (float)iVar5;
      __src = (void *)((long)__src + (long)iVar1 * (long)image.width);
      iVar3 = iVar3 + iVar4;
      iVar5 = iVar5 + 1;
    } while (fVar6 < fStack_64);
  }
  return __return_storage_ptr__;
}

Assistant:

Image ImageFromImage(Image image, Rectangle rec)
{
    Image result = { 0 };

    int bytesPerPixel = GetPixelDataSize(1, 1, image.format);

    // TODO: Check rec is valid?

    result.width = (int)rec.width;
    result.height = (int)rec.height;
    result.data = RL_CALLOC((int)(rec.width*rec.height)*bytesPerPixel, 1);
    result.format = image.format;
    result.mipmaps = 1;

    for (int y = 0; y < rec.height; y++)
    {
        memcpy(((unsigned char *)result.data) + y*(int)rec.width*bytesPerPixel, ((unsigned char *)image.data) + ((y + (int)rec.y)*image.width + (int)rec.x)*bytesPerPixel, (int)rec.width*bytesPerPixel);
    }

    return result;
}